

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Totals * __thiscall Catch::RunContext::runTest(RunContext *this,TestCaseHandle *testCase)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  IEventListener *pIVar4;
  SectionTracker *pSVar5;
  RunContext *pRVar6;
  TestCaseHandle *in_RDX;
  long in_RSI;
  Totals *in_RDI;
  TestCaseStats statsForOneRun;
  Totals singleRunTotals;
  string oneRunCerr;
  string oneRunCout;
  Totals beforeRunTotals;
  string redirectedCerr;
  string redirectedCout;
  uint64_t testRuns;
  ITracker *rootTracker;
  TestCaseInfo *testInfo;
  Totals prevTotals;
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  RunContext *in_stack_fffffffffffffcc0;
  Totals *in_stack_fffffffffffffcc8;
  TestCaseInfo *_stdOut;
  undefined4 in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd4;
  undefined1 in_stack_fffffffffffffcd5;
  byte in_stack_fffffffffffffcd6;
  undefined1 in_stack_fffffffffffffcd7;
  TestCaseInfo *_testInfo;
  undefined7 in_stack_fffffffffffffce0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd28;
  SectionTracker *in_stack_fffffffffffffd30;
  TrackerContext *in_stack_fffffffffffffd50;
  NameAndLocationRef *in_stack_fffffffffffffd58;
  TrackerContext *in_stack_fffffffffffffd60;
  undefined1 local_248 [208];
  string local_178 [32];
  string local_158 [32];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  string *redirectedCerr_00;
  string *redirectedCout_00;
  StringRef local_e8;
  NameAndLocationRef local_d8;
  string local_a8 [32];
  string local_88 [32];
  long local_68;
  ITracker *local_60;
  TestCaseInfo *local_58;
  undefined1 local_50 [64];
  TestCaseHandle *local_10;
  
  local_10 = in_RDX;
  memcpy(local_50,(void *)(in_RSI + 200),0x40);
  local_58 = TestCaseHandle::getTestCaseInfo(local_10);
  pIVar4 = Detail::unique_ptr<Catch::IEventListener>::operator->
                     ((unique_ptr<Catch::IEventListener> *)(in_RSI + 0x108));
  (*pIVar4->_vptr_IEventListener[5])(pIVar4,local_58);
  *(TestCaseHandle **)(in_RSI + 0x18) = local_10;
  local_60 = TestCaseTracking::TrackerContext::startRun(in_stack_fffffffffffffd50);
  (**(code **)(**(long **)(in_RSI + 0xc0) + 0xa8))();
  TestCaseTracking::SectionTracker::addInitialFilters
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  seedRng((IConfig *)in_stack_fffffffffffffcc0);
  local_68 = 0;
  std::__cxx11::string::string(local_88);
  std::__cxx11::string::string(local_a8);
  do {
    TestCaseTracking::TrackerContext::startCycle((TrackerContext *)in_stack_fffffffffffffcc0);
    StringRef::StringRef
              ((StringRef *)in_stack_fffffffffffffcc0,
               (string *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
    redirectedCout_00 = (string *)(local_58->lineInfo).file;
    pRVar6 = (RunContext *)(local_58->lineInfo).line;
    TestCaseTracking::NameAndLocationRef::NameAndLocationRef(&local_d8,local_e8,local_58->lineInfo);
    pSVar5 = TestCaseTracking::SectionTracker::acquire
                       (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    *(SectionTracker **)(in_RSI + 0x20) = pSVar5;
    pIVar4 = Detail::unique_ptr<Catch::IEventListener>::operator->
                       ((unique_ptr<Catch::IEventListener> *)(in_RSI + 0x108));
    (*pIVar4->_vptr_IEventListener[6])(pIVar4,local_58,local_68);
    local_138 = *(undefined8 *)(in_RSI + 200);
    uStack_130 = *(undefined8 *)(in_RSI + 0xd0);
    local_128 = *(undefined8 *)(in_RSI + 0xd8);
    uStack_120 = *(undefined8 *)(in_RSI + 0xe0);
    local_118 = *(undefined8 *)(in_RSI + 0xe8);
    uStack_110 = *(undefined8 *)(in_RSI + 0xf0);
    local_108 = *(undefined8 *)(in_RSI + 0xf8);
    redirectedCerr_00 = *(string **)(in_RSI + 0x100);
    std::__cxx11::string::string(local_158);
    std::__cxx11::string::string(local_178);
    runCurrentTest(pRVar6,redirectedCout_00,redirectedCerr_00);
    std::__cxx11::string::operator+=(local_88,local_158);
    std::__cxx11::string::operator+=(local_a8,local_178);
    Totals::delta((Totals *)
                  CONCAT17(in_stack_fffffffffffffcd7,
                           CONCAT16(in_stack_fffffffffffffcd6,
                                    CONCAT15(in_stack_fffffffffffffcd5,
                                             CONCAT14(in_stack_fffffffffffffcd4,
                                                      in_stack_fffffffffffffcd0)))),
                  in_stack_fffffffffffffcc8);
    _testInfo = local_58;
    uVar1 = aborting(in_stack_fffffffffffffcc0);
    TestCaseStats::TestCaseStats
              ((TestCaseStats *)CONCAT17(uVar1,in_stack_fffffffffffffce0),_testInfo,
               (Totals *)
               CONCAT17(in_stack_fffffffffffffcd7,
                        CONCAT16(in_stack_fffffffffffffcd6,
                                 CONCAT15(in_stack_fffffffffffffcd5,
                                          CONCAT14(in_stack_fffffffffffffcd4,
                                                   in_stack_fffffffffffffcd0)))),
               (string *)in_stack_fffffffffffffcc8,(string *)in_stack_fffffffffffffcc0,
               (bool)in_stack_fffffffffffffcbf);
    pIVar4 = Detail::unique_ptr<Catch::IEventListener>::operator->
                       ((unique_ptr<Catch::IEventListener> *)(in_RSI + 0x108));
    (*pIVar4->_vptr_IEventListener[0xf])(pIVar4,local_248,local_68);
    local_68 = local_68 + 1;
    TestCaseStats::~TestCaseStats((TestCaseStats *)in_stack_fffffffffffffcc0);
    std::__cxx11::string::~string(local_178);
    std::__cxx11::string::~string(local_158);
    in_stack_fffffffffffffcd7 =
         TestCaseTracking::ITracker::isSuccessfullyCompleted(*(ITracker **)(in_RSI + 0x20));
    in_stack_fffffffffffffcd6 = 0;
    if (!(bool)in_stack_fffffffffffffcd7) {
      in_stack_fffffffffffffcd5 = aborting(in_stack_fffffffffffffcc0);
      in_stack_fffffffffffffcd6 = in_stack_fffffffffffffcd5 ^ 0xff;
    }
  } while ((in_stack_fffffffffffffcd6 & 1) != 0);
  Totals::delta((Totals *)
                CONCAT17(in_stack_fffffffffffffcd7,
                         CONCAT16(in_stack_fffffffffffffcd6,
                                  CONCAT15(in_stack_fffffffffffffcd5,
                                           CONCAT14(in_stack_fffffffffffffcd4,
                                                    in_stack_fffffffffffffcd0)))),
                in_stack_fffffffffffffcc8);
  uVar2 = TestCaseInfo::expectedToFail((TestCaseInfo *)0x18f087);
  if (((bool)uVar2) && ((in_RDI->testCases).passed != 0)) {
    (in_RDI->assertions).failed = (in_RDI->assertions).failed + 1;
    (in_RDI->testCases).passed = (in_RDI->testCases).passed - 1;
    (in_RDI->testCases).failed = (in_RDI->testCases).failed + 1;
  }
  Counts::operator+=((Counts *)(in_RSI + 0xe8),&in_RDI->testCases);
  pRVar6 = (RunContext *)
           Detail::unique_ptr<Catch::IEventListener>::operator->
                     ((unique_ptr<Catch::IEventListener> *)(in_RSI + 0x108));
  _stdOut = local_58;
  bVar3 = aborting(pRVar6);
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)CONCAT17(uVar1,in_stack_fffffffffffffce0),_testInfo,
             (Totals *)
             CONCAT17(in_stack_fffffffffffffcd7,
                      CONCAT16(in_stack_fffffffffffffcd6,
                               CONCAT15(in_stack_fffffffffffffcd5,
                                        CONCAT14(uVar2,CONCAT13(bVar3,(int3)
                                                  in_stack_fffffffffffffcd0))))),&_stdOut->name,
             (string *)pRVar6,(bool)in_stack_fffffffffffffcbf);
  (*(pRVar6->super_IResultCapture)._vptr_IResultCapture[0x10])(pRVar6,&stack0xfffffffffffffd28);
  TestCaseStats::~TestCaseStats((TestCaseStats *)pRVar6);
  *(undefined8 *)(in_RSI + 0x18) = 0;
  *(undefined8 *)(in_RSI + 0x20) = 0;
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_88);
  return in_RDI;
}

Assistant:

Totals RunContext::runTest(TestCaseHandle const& testCase) {
        const Totals prevTotals = m_totals;

        auto const& testInfo = testCase.getTestCaseInfo();
        m_reporter->testCaseStarting(testInfo);
        m_activeTestCase = &testCase;


        ITracker& rootTracker = m_trackerContext.startRun();
        assert(rootTracker.isSectionTracker());
        static_cast<SectionTracker&>(rootTracker).addInitialFilters(m_config->getSectionsToRun());

        // We intentionally only seed the internal RNG once per test case,
        // before it is first invoked. The reason for that is a complex
        // interplay of generator/section implementation details and the
        // Random*Generator types.
        //
        // The issue boils down to us needing to seed the Random*Generators
        // with different seed each, so that they return different sequences
        // of random numbers. We do this by giving them a number from the
        // shared RNG instance as their seed.
        //
        // However, this runs into an issue if the reseeding happens each
        // time the test case is entered (as opposed to first time only),
        // because multiple generators could get the same seed, e.g. in
        // ```cpp
        // TEST_CASE() {
        //     auto i = GENERATE(take(10, random(0, 100));
        //     SECTION("A") {
        //         auto j = GENERATE(take(10, random(0, 100));
        //     }
        //     SECTION("B") {
        //         auto k = GENERATE(take(10, random(0, 100));
        //     }
        // }
        // ```
        // `i` and `j` would properly return values from different sequences,
        // but `i` and `k` would return the same sequence, because their seed
        // would be the same.
        // (The reason their seeds would be the same is that the generator
        //  for k would be initialized when the test case is entered the second
        //  time, after the shared RNG instance was reset to the same value
        //  it had when the generator for i was initialized.)
        seedRng( *m_config );

        uint64_t testRuns = 0;
        std::string redirectedCout;
        std::string redirectedCerr;
        do {
            m_trackerContext.startCycle();
            m_testCaseTracker = &SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocationRef(testInfo.name, testInfo.lineInfo));

            m_reporter->testCasePartialStarting(testInfo, testRuns);

            const auto beforeRunTotals = m_totals;
            std::string oneRunCout, oneRunCerr;
            runCurrentTest(oneRunCout, oneRunCerr);
            redirectedCout += oneRunCout;
            redirectedCerr += oneRunCerr;

            const auto singleRunTotals = m_totals.delta(beforeRunTotals);
            auto statsForOneRun = TestCaseStats(testInfo, singleRunTotals, CATCH_MOVE(oneRunCout), CATCH_MOVE(oneRunCerr), aborting());

            m_reporter->testCasePartialEnded(statsForOneRun, testRuns);
            ++testRuns;
        } while (!m_testCaseTracker->isSuccessfullyCompleted() && !aborting());

        Totals deltaTotals = m_totals.delta(prevTotals);
        if (testInfo.expectedToFail() && deltaTotals.testCases.passed > 0) {
            deltaTotals.assertions.failed++;
            deltaTotals.testCases.passed--;
            deltaTotals.testCases.failed++;
        }
        m_totals.testCases += deltaTotals.testCases;
        m_reporter->testCaseEnded(TestCaseStats(testInfo,
                                  deltaTotals,
                                  CATCH_MOVE(redirectedCout),
                                  CATCH_MOVE(redirectedCerr),
                                  aborting()));

        m_activeTestCase = nullptr;
        m_testCaseTracker = nullptr;

        return deltaTotals;
    }